

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# daily_file_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator>::delete_old_
          (daily_file_sink<std::mutex,_spdlog::sinks::daily_filename_calculator> *this)

{
  bool bVar1;
  int iVar2;
  filename_t *pfVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  filename_t *in_RDI;
  bool ok;
  type old_filename;
  filename_t current_file;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int last_errno;
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff60;
  string local_58 [48];
  string local_28 [40];
  
  pfVar3 = details::file_helper::filename_abi_cxx11_((file_helper *)(in_RDI + 0x70));
  std::__cxx11::string::string(local_28,(string *)pfVar3);
  bVar1 = details::
          circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::full((circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(in_RDI + 0xa8));
  last_errno = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff5c);
  if (bVar1) {
    filename = details::
               circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::front((circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)0x1479da);
    std::__cxx11::string::string(local_58,(string *)filename);
    details::
    circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pop_front((circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(in_RDI + 0xa8));
    iVar2 = details::os::remove_if_exists(in_RDI);
    if (iVar2 != 0) {
      details::
      circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      push_back(in_stack_ffffffffffffff60,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(last_errno,in_stack_ffffffffffffff58));
      details::os::filename_to_str(filename);
      std::operator+((char *)CONCAT44(last_errno,in_stack_ffffffffffffff58),in_RDI);
      __errno_location();
      throw_spdlog_ex((string *)in_stack_ffffffffffffff60,last_errno);
    }
    std::__cxx11::string::~string(local_58);
  }
  details::
  circular_q<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  push_back(in_stack_ffffffffffffff60,
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            CONCAT44(last_errno,in_stack_ffffffffffffff58));
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void delete_old_()
    {
        using details::os::filename_to_str;
        using details::os::remove_if_exists;

        filename_t current_file = file_helper_.filename();
        if (filenames_q_.full())
        {
            auto old_filename = std::move(filenames_q_.front());
            filenames_q_.pop_front();
            bool ok = remove_if_exists(old_filename) == 0;
            if (!ok)
            {
                filenames_q_.push_back(std::move(current_file));
                throw_spdlog_ex("Failed removing daily file " + filename_to_str(old_filename), errno);
            }
        }
        filenames_q_.push_back(std::move(current_file));
    }